

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatadst-tj.c
# Opt level: O0

void jpeg_mem_dest_tj(j_compress_ptr cinfo,uchar **outbuffer,unsigned_long *outsize,boolean alloc)

{
  long *plVar1;
  bool bVar2;
  long lVar3;
  void *pvVar4;
  int in_ECX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  my_mem_dest_ptr dest;
  boolean reused;
  
  bVar2 = false;
  if ((in_RSI == (long *)0x0) || (in_RDX == (long *)0x0)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x17;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (in_RDI[5] == 0) {
    lVar3 = (**(code **)in_RDI[1])(in_RDI,0,0x58);
    in_RDI[5] = lVar3;
    lVar3 = in_RDI[5];
    *(undefined8 *)(lVar3 + 0x38) = 0;
    *(undefined8 *)(lVar3 + 0x40) = 0;
  }
  else if (*(code **)(in_RDI[5] + 0x10) != init_mem_destination) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x17;
    (**(code **)*in_RDI)(in_RDI);
  }
  plVar1 = (long *)in_RDI[5];
  plVar1[2] = (long)init_mem_destination;
  plVar1[3] = (long)empty_mem_output_buffer;
  plVar1[4] = (long)term_mem_destination;
  if (((plVar1[8] == *in_RSI) && (*in_RSI != 0)) && (in_ECX != 0)) {
    bVar2 = true;
  }
  plVar1[5] = (long)in_RSI;
  plVar1[6] = (long)in_RDX;
  *(int *)(plVar1 + 10) = in_ECX;
  if ((*in_RSI == 0) || (*in_RDX == 0)) {
    if (in_ECX == 0) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x17;
      (**(code **)*in_RDI)(in_RDI);
    }
    else {
      pvVar4 = malloc(0x1000);
      *in_RSI = (long)pvVar4;
      plVar1[7] = (long)pvVar4;
      if (plVar1[7] == 0) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x36;
        *(undefined4 *)(*in_RDI + 0x2c) = 10;
        (**(code **)*in_RDI)(in_RDI);
      }
      *in_RDX = 0x1000;
    }
  }
  lVar3 = *in_RSI;
  plVar1[8] = lVar3;
  *plVar1 = lVar3;
  if (!bVar2) {
    plVar1[9] = *in_RDX;
  }
  plVar1[1] = plVar1[9];
  return;
}

Assistant:

GLOBAL(void)
jpeg_mem_dest_tj(j_compress_ptr cinfo, unsigned char **outbuffer,
                 unsigned long *outsize, boolean alloc)
{
  boolean reused = FALSE;
  my_mem_dest_ptr dest;

  if (outbuffer == NULL || outsize == NULL)     /* sanity check */
    ERREXIT(cinfo, JERR_BUFFER_SIZE);

  /* The destination object is made permanent so that multiple JPEG images
   * can be written to the same buffer without re-executing jpeg_mem_dest.
   */
  if (cinfo->dest == NULL) {    /* first time for this JPEG object? */
    cinfo->dest = (struct jpeg_destination_mgr *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_PERMANENT,
                                  sizeof(my_mem_destination_mgr));
    dest = (my_mem_dest_ptr)cinfo->dest;
    dest->newbuffer = NULL;
    dest->buffer = NULL;
  } else if (cinfo->dest->init_destination != init_mem_destination) {
    /* It is unsafe to reuse the existing destination manager unless it was
     * created by this function.
     */
    ERREXIT(cinfo, JERR_BUFFER_SIZE);
  }

  dest = (my_mem_dest_ptr)cinfo->dest;
  dest->pub.init_destination = init_mem_destination;
  dest->pub.empty_output_buffer = empty_mem_output_buffer;
  dest->pub.term_destination = term_mem_destination;
  if (dest->buffer == *outbuffer && *outbuffer != NULL && alloc)
    reused = TRUE;
  dest->outbuffer = outbuffer;
  dest->outsize = outsize;
  dest->alloc = alloc;

  if (*outbuffer == NULL || *outsize == 0) {
    if (alloc) {
      /* Allocate initial buffer */
      dest->newbuffer = *outbuffer = (unsigned char *)malloc(OUTPUT_BUF_SIZE);
      if (dest->newbuffer == NULL)
        ERREXIT1(cinfo, JERR_OUT_OF_MEMORY, 10);
      *outsize = OUTPUT_BUF_SIZE;
    } else
      ERREXIT(cinfo, JERR_BUFFER_SIZE);
  }

  dest->pub.next_output_byte = dest->buffer = *outbuffer;
  if (!reused)
    dest->bufsize = *outsize;
  dest->pub.free_in_buffer = dest->bufsize;
}